

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Type *pTVar2;
  int iVar3;
  
  iVar1 = this->current_size_;
  iVar3 = this->allocated_size_;
  if (iVar1 < iVar3) {
    this->current_size_ = iVar1 + 1;
    pTVar2 = (Type *)this->elements_[iVar1];
  }
  else {
    if (iVar3 == this->total_size_) {
      Reserve(this,iVar3 + 1);
      iVar3 = this->allocated_size_;
    }
    this->allocated_size_ = iVar3 + 1;
    pTVar2 = GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
    iVar1 = this->current_size_;
    this->current_size_ = iVar1 + 1;
    this->elements_[iVar1] = pTVar2;
  }
  return pTVar2;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add() {
  if (current_size_ < allocated_size_) {
    return cast<TypeHandler>(elements_[current_size_++]);
  }
  if (allocated_size_ == total_size_) Reserve(total_size_ + 1);
  ++allocated_size_;
  typename TypeHandler::Type* result = TypeHandler::New();
  elements_[current_size_++] = result;
  return result;
}